

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void spo_var_init(sp_coder *coder)

{
  opvar *ov;
  opvar *ov_00;
  char *pcVar1;
  opvar *poVar2;
  splev_var *psVar3;
  opvar *poVar4;
  long lVar5;
  long local_40;
  long idx;
  splev_var *tmp2;
  splev_var *tmpvar;
  opvar *vvalue;
  opvar *arraylen;
  opvar *vname;
  sp_coder *coder_local;
  
  ov = splev_stack_getdat(coder,'\x02');
  ov_00 = splev_stack_getdat(coder,'\x01');
  if ((ov == (opvar *)0x0) || (ov_00 == (opvar *)0x0)) {
    panic("no values for SPO_VAR_INIT");
  }
  tmp2 = opvar_var_defined(coder,(ov->vardata).str);
  if (tmp2 == (splev_var *)0x0) {
    tmp2 = (splev_var *)malloc(0x28);
    if (tmp2 == (splev_var *)0x0) {
      return;
    }
    tmp2->next = coder->frame->variables;
    pcVar1 = strdup((ov->vardata).str);
    tmp2->name = pcVar1;
    coder->frame->variables = tmp2;
    if ((ov_00->vardata).l < 0) goto LAB_002e9bee;
    if ((ov_00->vardata).str == (char *)0x0) {
      poVar2 = splev_stack_getdat_any(coder);
      if (poVar2 == (opvar *)0x0) {
        panic("no value for variable");
      }
      tmp2->svtyp = poVar2->spovartyp;
      (tmp2->data).value = poVar2;
      tmp2->array_len = 0;
      goto LAB_002e9e03;
    }
  }
  else {
    if ((ov_00->vardata).l < 0) {
      if (tmp2->array_len == 0) {
        if ((tmp2->data).value == (opvar *)0x0) {
          impossible("opvar_free(), %s","spo_var_init");
        }
        else {
          opvar_free_x((tmp2->data).value);
          (tmp2->data).value = (opvar *)0x0;
        }
      }
      else {
        local_40 = tmp2->array_len;
        while (lVar5 = local_40 + -1, 0 < local_40) {
          local_40 = lVar5;
          if (*(long *)((long)(tmp2->data).value + lVar5 * 8) == 0) {
            impossible("opvar_free(), %s","spo_var_init");
          }
          else {
            opvar_free_x(*(opvar **)((long)(tmp2->data).value + lVar5 * 8));
            *(undefined8 *)((long)(tmp2->data).value + lVar5 * 8) = 0;
          }
        }
        free((tmp2->data).value);
      }
      (tmp2->data).value = (opvar *)0x0;
LAB_002e9bee:
      poVar2 = splev_stack_getdat_any(coder);
      psVar3 = opvar_var_defined(coder,(poVar2->vardata).str);
      if (psVar3 == (splev_var *)0x0) {
        panic("no copyable var");
      }
      tmp2->svtyp = psVar3->svtyp;
      tmp2->array_len = psVar3->array_len;
      if (tmp2->array_len == 0) {
        poVar4 = opvar_clone((psVar3->data).value);
        (tmp2->data).value = poVar4;
      }
      else {
        local_40 = tmp2->array_len;
        poVar4 = (opvar *)malloc(local_40 << 3);
        (tmp2->data).value = poVar4;
        while (lVar5 = local_40 + -1, 0 < local_40) {
          poVar4 = opvar_clone(*(opvar **)((long)(psVar3->data).value + lVar5 * 8));
          *(opvar **)((long)(tmp2->data).value + lVar5 * 8) = poVar4;
          local_40 = lVar5;
        }
      }
      if (poVar2 == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_var_init");
      }
      else {
        opvar_free_x(poVar2);
      }
      goto LAB_002e9e03;
    }
    if ((ov_00->vardata).str == (char *)0x0) {
      poVar2 = splev_stack_getdat_any(coder);
      if (tmp2->svtyp != poVar2->spovartyp) {
        panic("redefining variable as different type");
      }
      if ((tmp2->data).value == (opvar *)0x0) {
        impossible("opvar_free(), %s","spo_var_init");
      }
      else {
        opvar_free_x((tmp2->data).value);
        (tmp2->data).value = (opvar *)0x0;
      }
      (tmp2->data).value = poVar2;
      tmp2->array_len = 0;
      goto LAB_002e9e03;
    }
    local_40 = tmp2->array_len;
    while (lVar5 = local_40 + -1, 0 < local_40) {
      local_40 = lVar5;
      if (*(long *)((long)(tmp2->data).value + lVar5 * 8) == 0) {
        impossible("opvar_free(), %s","spo_var_init");
      }
      else {
        opvar_free_x(*(opvar **)((long)(tmp2->data).value + lVar5 * 8));
        *(undefined8 *)((long)(tmp2->data).value + lVar5 * 8) = 0;
      }
    }
    free((tmp2->data).value);
    (tmp2->data).value = (opvar *)0x0;
  }
  local_40 = (ov_00->vardata).l;
  tmp2->array_len = local_40;
  poVar2 = (opvar *)malloc(local_40 << 3);
  (tmp2->data).value = poVar2;
  if ((tmp2->data).value == (opvar *)0x0) {
    panic("malloc tmpvar->data.arrayvalues");
  }
  while (0 < local_40) {
    poVar2 = splev_stack_getdat_any(coder);
    if (poVar2 == (opvar *)0x0) {
      panic("no value for arrayvariable");
    }
    *(opvar **)((long)(tmp2->data).value + (local_40 + -1) * 8) = poVar2;
    local_40 = local_40 + -1;
  }
  tmp2->svtyp = '@';
LAB_002e9e03:
  if (ov == (opvar *)0x0) {
    impossible("opvar_free(), %s","spo_var_init");
  }
  else {
    opvar_free_x(ov);
  }
  if (ov_00 == (opvar *)0x0) {
    impossible("opvar_free(), %s","spo_var_init");
  }
  else {
    opvar_free_x(ov_00);
  }
  return;
}

Assistant:

static void spo_var_init(struct sp_coder *coder)
{
	struct opvar *vname;
	struct opvar *arraylen;
	struct opvar *vvalue;
	struct splev_var *tmpvar;
	struct splev_var *tmp2;
	long idx;

	OV_pop_s(vname);
	OV_pop_i(arraylen);

	if (!vname || !arraylen)
	    panic("no values for SPO_VAR_INIT");

	tmpvar = opvar_var_defined(coder, OV_s(vname));

	if (tmpvar) {
	    /* variable redefinition */
	    if (OV_i(arraylen) < 0) {
		/* copy variable */
		if (tmpvar->array_len) {
		    idx = tmpvar->array_len;
		    while (idx-- > 0)
			opvar_free(tmpvar->data.arrayvalues[idx]);
		    free(tmpvar->data.arrayvalues);
		} else {
		    opvar_free(tmpvar->data.value);
		}
		tmpvar->data.arrayvalues = NULL;
		goto copy_variable;
	    } else if (OV_i(arraylen)) {
		/* redefined array */
		idx = tmpvar->array_len;
		while (idx-- > 0)
		    opvar_free(tmpvar->data.arrayvalues[idx]);
		free(tmpvar->data.arrayvalues);
		tmpvar->data.arrayvalues = NULL;
		goto create_new_array;
	    } else {
		/* redefined single value */
		OV_pop(vvalue);
		if (tmpvar->svtyp != vvalue->spovartyp)
		    panic("redefining variable as different type");
		opvar_free(tmpvar->data.value);
		tmpvar->data.value = vvalue;
		tmpvar->array_len = 0;
	    }
	} else {
	    /* new variable definition */
	    tmpvar = malloc(sizeof(struct splev_var));
	    if (!tmpvar) return;

	    tmpvar->next = coder->frame->variables;
	    tmpvar->name = strdup(OV_s(vname));
	    coder->frame->variables = tmpvar;

	    if (OV_i(arraylen) < 0) {
		/* copy variable */
copy_variable:
		OV_pop(vvalue);
		tmp2 = opvar_var_defined(coder, OV_s(vvalue));
		if (!tmp2)
		    panic("no copyable var");
		tmpvar->svtyp = tmp2->svtyp;
		tmpvar->array_len = tmp2->array_len;
		if (tmpvar->array_len) {
		    idx = tmpvar->array_len;
		    tmpvar->data.arrayvalues = malloc(sizeof(struct opvar *) * idx);
		    while (idx-- > 0) {
			tmpvar->data.arrayvalues[idx] =
				opvar_clone(tmp2->data.arrayvalues[idx]);
		    }
		} else {
		    tmpvar->data.value = opvar_clone(tmp2->data.value);
		}
		opvar_free(vvalue);
	    } else if (OV_i(arraylen)) {
		/* new array */
create_new_array:
		idx = OV_i(arraylen);
		tmpvar->array_len = idx;
		tmpvar->data.arrayvalues = malloc(sizeof(struct opvar *) * idx);
		if (!tmpvar->data.arrayvalues)
		    panic("malloc tmpvar->data.arrayvalues");
		while (idx-- > 0) {
		    OV_pop(vvalue);
		    if (!vvalue)
			panic("no value for arrayvariable");
		    tmpvar->data.arrayvalues[idx] = vvalue;
		}
		tmpvar->svtyp = SPOVAR_ARRAY;
	    } else {
		/* new single value */
		OV_pop(vvalue);
		if (!vvalue)
		    panic("no value for variable");
		tmpvar->svtyp = OV_typ(vvalue);
		tmpvar->data.value = vvalue;
		tmpvar->array_len = 0;
	    }
	}

	opvar_free(vname);
	opvar_free(arraylen);
}